

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O3

bool ON_ViewportFromRhinoView
               (view_projection projection,ON_3dPoint *rhvp_target,double rhvp_angle1,
               double rhvp_angle2,double rhvp_angle3,double rhvp_viewsize,double rhvp_cameradist,
               int screen_width,int screen_height,ON_Viewport *vp)

{
  double dVar1;
  ON_3dVector axis;
  ON_3dVector axis_00;
  ON_3dVector axis_01;
  ON_3dPoint center;
  ON_3dPoint center_00;
  ON_3dPoint center_01;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  bool bVar6;
  undefined1 uVar7;
  long lVar9;
  ON_3dVector *pOVar10;
  ON_Xform *pOVar11;
  byte bVar12;
  double dVar13;
  ulong uVar14;
  double dVar15;
  double frus_near;
  ON_Xform R1;
  ON_Xform RhinoRot;
  ON_Xform R3;
  ON_Xform R2;
  ON_3dVector local_348 [5];
  ON_3dVector local_2c8;
  ON_Xform local_2b0;
  ON_Xform local_230;
  ON_Xform local_1b0;
  ON_Xform local_130;
  ON_Xform local_b0;
  int iVar8;
  
  bVar12 = 0;
  if (vp->m_projection != projection) {
    vp->m_projection = (projection == perspective_view) + parallel_view;
  }
  dVar13 = 1000.0;
  dVar1 = 1000.0;
  if (0 < screen_height && 0 < screen_width) {
    dVar1 = (double)screen_height;
    dVar13 = (double)screen_width;
  }
  ON_Xform::ON_Xform(&local_230);
  ON_Xform::ON_Xform(&local_b0);
  ON_Xform::ON_Xform(&local_130);
  ON_Xform::ON_Xform(&local_1b0);
  uVar5 = 0;
  uVar7 = 0;
  if ((((0.0 < rhvp_cameradist) && (uVar7 = uVar5, 0.0 < rhvp_viewsize)) && (1.0 <= dVar1)) &&
     (1.0 <= dVar13)) {
    axis.y = ON_3dVector::ZAxis.y;
    axis.x = ON_3dVector::ZAxis.x;
    axis.z = ON_3dVector::ZAxis.z;
    center.y = ON_3dPoint::Origin.y;
    center.x = ON_3dPoint::Origin.x;
    center.z = ON_3dPoint::Origin.z;
    ON_Xform::Rotation(&local_230,rhvp_angle1,axis,center);
    axis_00.y = ON_3dVector::XAxis.y;
    axis_00.x = ON_3dVector::XAxis.x;
    axis_00.z = ON_3dVector::XAxis.z;
    center_00.y = ON_3dPoint::Origin.y;
    center_00.x = ON_3dPoint::Origin.x;
    center_00.z = ON_3dPoint::Origin.z;
    ON_Xform::Rotation(&local_b0,rhvp_angle2,axis_00,center_00);
    axis_01.y = ON_3dVector::ZAxis.y;
    axis_01.x = ON_3dVector::ZAxis.x;
    axis_01.z = ON_3dVector::ZAxis.z;
    center_01.y = ON_3dPoint::Origin.y;
    center_01.x = ON_3dPoint::Origin.x;
    center_01.z = ON_3dPoint::Origin.z;
    ON_Xform::Rotation(&local_130,rhvp_angle3,axis_01,center_01);
    ON_Xform::operator*(&local_2b0,&local_130,&local_b0);
    ON_Xform::operator*((ON_Xform *)local_348,&local_2b0,&local_230);
    pOVar10 = local_348;
    pOVar11 = &local_1b0;
    for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
      pOVar11->m_xform[0][0] = (*(double (*) [4])&pOVar10->x)[0];
      pOVar10 = (ON_3dVector *)((long)pOVar10 + ((ulong)bVar12 * -2 + 1) * 8);
      pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar12 * -2 + 1) * 8);
    }
    ON_Xform::operator*(local_348,&local_1b0,&ON_3dVector::YAxis);
    ON_Viewport::SetCameraUp(vp,local_348);
    ON_Xform::operator*((ON_3dVector *)&local_2b0,&local_1b0,&ON_3dVector::ZAxis);
    ON_3dVector::operator-(local_348,(ON_3dVector *)&local_2b0);
    ON_Viewport::SetCameraDirection(vp,local_348);
    local_2c8.z = (vp->m_CamDir).z;
    local_2c8.x = (vp->m_CamDir).x;
    local_2c8.y = (vp->m_CamDir).y;
    operator*((ON_3dVector *)&local_2b0,rhvp_cameradist,&local_2c8);
    ON_3dPoint::operator-((ON_3dPoint *)local_348,rhvp_target,(ON_3dVector *)&local_2b0);
    ON_Viewport::SetCameraLocation(vp,(ON_3dPoint *)local_348);
    local_348[0].z = rhvp_target->z;
    local_348[0].x = rhvp_target->x;
    local_348[0].y = rhvp_target->y;
    bVar6 = ON_3dPoint::IsValid((ON_3dPoint *)local_348);
    if ((bVar6) ||
       (bVar6 = ON_3dPoint::operator==(&ON_3dPoint::UnsetPoint,(ON_3dPoint *)local_348), bVar6)) {
      (vp->m_target_point).z = local_348[0].z;
      (vp->m_target_point).x = local_348[0].x;
      (vp->m_target_point).y = local_348[0].y;
    }
    dVar15 = dVar13 * rhvp_viewsize;
    uVar14 = ~-(ulong)(dVar1 < dVar13) & (ulong)rhvp_viewsize;
    if (dVar13 <= dVar1) {
      rhvp_viewsize = (rhvp_viewsize * dVar1) / dVar13;
    }
    frus_near = 1.0;
    if (rhvp_cameradist * 0.015625 <= 1.0) {
      frus_near = rhvp_cameradist * 0.015625;
    }
    dVar15 = (double)(uVar14 | (ulong)(dVar15 / dVar1) & -(ulong)(dVar1 < dVar13));
    if (vp->m_projection == perspective_view) {
      dVar15 = dVar15 * frus_near;
      rhvp_viewsize = rhvp_viewsize * frus_near;
    }
    ON_Viewport::SetFrustum
              (vp,-dVar15,dVar15,-rhvp_viewsize,rhvp_viewsize,frus_near,rhvp_cameradist * 4.0);
    if ((int)dVar1 != 0 && (int)dVar13 != 0) {
      *(undefined4 *)((vp->m_projection_content_sha1).m_digest + 0x10) =
           ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
      uVar4 = ON_SHA1_Hash::ZeroDigest.m_digest._12_4_;
      uVar3 = ON_SHA1_Hash::ZeroDigest.m_digest._8_4_;
      uVar2 = ON_SHA1_Hash::ZeroDigest.m_digest._4_4_;
      *(undefined4 *)(vp->m_projection_content_sha1).m_digest =
           ON_SHA1_Hash::ZeroDigest.m_digest._0_4_;
      *(undefined4 *)((vp->m_projection_content_sha1).m_digest + 4) = uVar2;
      *(undefined4 *)((vp->m_projection_content_sha1).m_digest + 8) = uVar3;
      *(undefined4 *)((vp->m_projection_content_sha1).m_digest + 0xc) = uVar4;
      vp->m_port_left = 0;
      vp->m_port_right = (int)dVar13;
      vp->m_port_bottom = (int)dVar1;
      vp->m_port_top = 0;
      vp->m_port_near = 0;
      vp->m_port_far = 0xffff;
      vp->m_bValidPort = true;
    }
    iVar8 = (*(vp->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(vp,0);
    uVar7 = (undefined1)iVar8;
  }
  return (bool)uVar7;
}

Assistant:

bool ON_ViewportFromRhinoView(
        ON::view_projection projection,
        const ON_3dPoint& rhvp_target, // 3d point
        double rhvp_angle1, double rhvp_angle2, double rhvp_angle3, // radians
        double rhvp_viewsize,     // > 0
        double rhvp_cameradist,   // > 0
        int screen_width, int screen_height,
        ON_Viewport& vp
        )
/*****************************************************************************
Compute canonical view projection information from Rhino viewport settings
INPUT:
  projection
  rhvp_target
    Rhino viewport target point (3d point that is center of view rotations)
  rhvp_angle1, rhvp_angle2, rhvp_angle3
    Rhino viewport angle settings
  rhvp_viewsize 
    In perspective, rhvp_viewsize = tangent(half lens angle).
    In parallel, rhvp_viewsize = 1/2 * minimum(frustum width,frustum height)
  rhvp_cameradistance ( > 0 )
    Distance from camera location to Rhino's "target" point
  screen_width, screen_height (0,0) if not known
*****************************************************************************/
{
  vp.SetProjection( projection );
  /*
  width, height
    width and height of viewport  
    ( = RhinoViewport->width, RhinoViewport->height )
  z_buffer_depth
    depth for the z buffer.  0xFFFF is currently used for Rhino
    quick rendering.
  */

  // In the situation where there is no physical display device, assume a
  // 1000 x 1000 "screen" and set the parameters accordingly.  Toolkit users
  // that are using this class to actually draw a picture, can make a subsequent
  // call to SetScreenPort().

  const double height = (screen_width < 1 || screen_height < 1) 
                      ? 1000.0 : (double)screen_height;
  const double width  = (screen_width < 1 || screen_height < 1) 
                      ? 1000.0 : (double)screen_width;
  //const int z_buffer_depth = 0xFFFF; // value Rhino "Shade" command uses

  // Use this function to obtain standard view information from a Rhino VIEWPORT
  // view. The Rhino viewport has many entries.  As of 17 October, 1997 all Rhino
  // world to clipping transformation information is derived from the VIEWPORT 
  // fields:
  //
  //   target, angle1, angle2, angle3, viewsize, and cameradist.
  //
  // The width, height and zbuffer_depth arguments are used to determine the
  // clipping to screen transformation.

  ON_Xform R1, R2, R3, RhinoRot;
  double frustum_left, frustum_right, frustum_bottom, frustum_top;
  double near_clipping_distance, far_clipping_distance;

  // Initialize default view in case input is garbage.
  if (height < 1)
    return false;
  if ( width < 1 )
    return false;
  if ( rhvp_viewsize <= 0.0 )
    return false;
  if ( rhvp_cameradist <= 0.0 )
    return false;

  // A Rhino 1.0 VIEWPORT structure describes the camera's location, direction,
  // and  orientation by specifying a rotation transformation that is
  // applied to an initial frame.  The rotation transformation is defined
  // as a sequence of 3 rotations abount fixed axes.  The initial frame
  // has the camera located at (0,0,cameradist), pointed in the direction
  // (0,0,-1), and oriented so that up is (0,1,0).

  R1.Rotation( rhvp_angle1, ON_3dVector::ZAxis, ON_3dPoint::Origin ); // so called "twist"
  R2.Rotation( rhvp_angle2, ON_3dVector::XAxis, ON_3dPoint::Origin ); // so called "elevation"
  R3.Rotation( rhvp_angle3, ON_3dVector::ZAxis, ON_3dPoint::Origin ); // so called "fudge factor"
  RhinoRot = R3 * R2 * R1;

  vp.SetCameraUp( RhinoRot*ON_3dVector::YAxis );
  vp.SetCameraDirection( -(RhinoRot*ON_3dVector::ZAxis) );
  vp.SetCameraLocation( rhvp_target - rhvp_cameradist*vp.CameraDirection() );
  vp.SetTargetPoint( rhvp_target );
  //vp.SetTargetDistance( rhvp_cameradist );

  // Camera coordinates "X" = CameraRight = CameraDirection x CameraUp
  // Camera coordinates "Y" = CameraUp
  // Camera coordinates "Z" = -CameraDirection

  // Rhino 1.0 did not support skew projections.  In other words, the
  // view frustum is symmetric and ray that begins at CameraLocation and 
  // goes along CameraDirection runs along the frustum's central axis.
  // The aspect ratio of the view frustum equals 
  // (screen port width)/(screen port height)
  // This means frus_left = -frus_right, frus_bottom = -frus_top, and
  // frus_top/frus_right = height/width

  // Set near and far clipping planes to some reasonable values.  If
  // the depth of the pixel is important, then the near and far clipping
  // plane will need to be adjusted later.
  // Rhino 1.0 didn't have a far clipping plane in wire frame (which explains
  // why you can get perspective views reversed through the origin by using 
  // the SetCameraTarget() command.  It's near clipping plane is set to 
  // a minuscule value.  For mesh rendering, it must come up with some
  // sort of reasonable near and far clipping planes because the zbuffer
  // is used correctly.  When time permits, I'll dig through the rendering
  // code and determine what values are being used.
  //
  near_clipping_distance = rhvp_cameradist/64.0;
  if ( near_clipping_distance > 1.0 )
    near_clipping_distance = 1.0;
  far_clipping_distance = 4.0*rhvp_cameradist;


  if ( width <= height )
  {
    frustum_right = rhvp_viewsize;
    frustum_top = frustum_right*height/width;
  }
  else
  {
    frustum_top = rhvp_viewsize;
    frustum_right = frustum_top*width/height;
  }
  if ( vp.IsPerspectiveProjection() )
  {
    frustum_right *= near_clipping_distance;
    frustum_top   *= near_clipping_distance;
  }
  frustum_left   = -frustum_right;
  frustum_bottom = -frustum_top;


  vp.SetFrustum( 
         frustum_left,   frustum_right, 
         frustum_bottom, frustum_top, 
         near_clipping_distance, far_clipping_distance );

  // Windows specific stuff that requires knowing size of client area in pixels
  vp.SetScreenPort( 0, (int)width, // windows has screen X increasing accross
                    (int)height,  0, // windows has screen Y increasing downwards
                    0, 0xFFFF );

  return (vp.IsValid()?true:false);
}